

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armor.cpp
# Opt level: O1

void wear(void)

{
  ItemThing *obj;
  char *pcVar1;
  
  obj = get_item("wear",3);
  if (obj != (ItemThing *)0x0) {
    if (cur_armor == (ItemThing *)0x0) {
      if (obj->type == 3) {
        waste_time();
        *(byte *)&obj->flags = (byte)obj->flags | 2;
        pcVar1 = inv_name(obj,true);
        cur_armor = obj;
        if (terse == false) {
          addmsg("you are now ");
        }
        msg("wearing %s",pcVar1);
        return;
      }
      msg("you can\'t wear that");
      return;
    }
    addmsg("you are already wearing some");
    if (terse == false) {
      addmsg(".  You\'ll have to take it off first");
    }
    endmsg();
    after = false;
  }
  return;
}

Assistant:

void wear()
{
    ItemThing *obj;
    const char *sp;

    if ((obj = get_item("wear", ARMOR)) == nullptr)
        return;
    if (cur_armor != nullptr)
    {
        addmsg("you are already wearing some");
        if (!terse)
            addmsg(".  You'll have to take it off first");
        endmsg();
        after = false;
        return;
    }
    if (obj->type != ARMOR)
    {
        msg("you can't wear that");
        return;
    }
    waste_time();
    obj->flags |= ISKNOW;
    sp = inv_name(obj, true);
    cur_armor = obj;
    if (!terse)
        addmsg("you are now ");
    msg("wearing %s", sp);
}